

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncheck.cpp
# Opt level: O0

bool validate(char *dirname)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  size_t sVar4;
  size_type sVar5;
  char *pcVar6;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  int i_3;
  int i_2;
  bool isok;
  bool allocok;
  ParsedJson pj;
  exception *e;
  string_view p;
  char *fullpath;
  size_t filelen;
  char *name;
  int i_1;
  bool needsep;
  size_t howmany;
  int i;
  bool *isfileasexpected;
  int c;
  dirent **entry_list;
  size_t dirlen;
  char *extension;
  bool everythingfine;
  char *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  ostream *in_stack_fffffffffffffe68;
  string_view *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bool local_145;
  int local_144;
  int local_140;
  string_view local_130 [7];
  allocator<char> local_b1;
  string local_b0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  size_t local_68;
  char *local_60;
  int local_58;
  bool local_51;
  long local_50;
  int local_44;
  void *local_40;
  int local_34;
  dirent **local_30;
  size_t local_28;
  char *local_20;
  byte local_11;
  char *local_10;
  byte local_1;
  
  local_11 = 1;
  local_20 = ".json";
  local_10 = in_RDI;
  local_28 = strlen(in_RDI);
  local_34 = scandir(local_10,&local_30,(__selector *)0x0,alphasort);
  if (local_34 < 0) {
    fprintf(_stderr,"error accessing %s \n",local_10);
    local_1 = 0;
  }
  else if (local_34 == 0) {
    printf("nothing in dir %s \n",local_10);
    local_1 = 0;
  }
  else {
    local_40 = operator_new__((long)local_34);
    for (local_44 = 0; local_44 < local_34; local_44 = local_44 + 1) {
      *(undefined1 *)((long)local_40 + (long)local_44) = 1;
    }
    local_50 = 0;
    sVar4 = strlen(local_10);
    pcVar6 = local_10;
    local_145 = false;
    if (1 < sVar4) {
      sVar4 = strlen(local_10);
      local_145 = pcVar6[sVar4 - 1] != '/';
    }
    bVar7._M_str = in_stack_fffffffffffffe90;
    bVar7._M_len = in_stack_fffffffffffffe98;
    local_51 = local_145;
    for (local_58 = 0; local_58 < local_34; local_58 = local_58 + 1) {
      local_60 = local_30[local_58]->d_name;
      bVar1 = hasExtension((char *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
      if (bVar1) {
        printf("validating: file %s ",local_60);
        fflush((FILE *)0x0);
        local_68 = strlen(local_60);
        local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   malloc(local_28 + local_68 + 2);
        strcpy((char *)local_70,local_10);
        if ((local_51 & 1U) == 0) {
          strcpy((char *)(&local_70->_M_dataplus + local_28),local_60);
        }
        else {
          (&local_70->_M_dataplus)[local_28] = (_Alloc_hider)0x2f;
          strcpy(&local_70->field_0x1 + local_28,local_60);
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80);
        this = local_70;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)bVar7._M_len,(allocator<char> *)bVar7._M_str);
        bVar7 = (basic_string_view<char,_std::char_traits<char>_>)get_corpus(local_b0);
        local_90 = bVar7;
        local_80 = bVar7;
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator(&local_b1);
        in_stack_fffffffffffffe70 = local_130;
        ParsedJson::ParsedJson((ParsedJson *)in_stack_fffffffffffffe70);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_80);
        bVar2 = ParsedJson::allocateCapacity((ulong)in_stack_fffffffffffffe70,sVar5);
        if ((bVar2 & 1) == 0) {
          in_stack_fffffffffffffe68 =
               std::operator<<((ostream *)&std::cerr,"can\'t allocate memory");
          std::ostream::operator<<(in_stack_fffffffffffffe68,std::endl<char,std::char_traits<char>>)
          ;
          local_1 = 0;
          bVar1 = true;
        }
        else {
          local_50 = local_50 + 1;
          bVar1 = json_parse(in_stack_fffffffffffffe70,(ParsedJson *)in_stack_fffffffffffffe68,
                             (bool)in_stack_fffffffffffffe67);
          in_stack_fffffffffffffe67 = bVar1;
          std::basic_string_view<char,_std::char_traits<char>_>::data(&local_80);
          aligned_free((void *)0x1029f4);
          pcVar6 = "invalid";
          if (bVar1) {
            pcVar6 = "ok";
          }
          printf("%s\n",pcVar6);
          bVar3 = contains((char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe58);
          if (bVar3) {
            local_50 = local_50 + -1;
          }
          else {
            bVar3 = startsWith((char *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
            if (bVar3) {
              if (!bVar1) {
                *(undefined1 *)((long)local_40 + (long)local_58) = 0;
                printf("warning: file %s should pass but it fails.\n",local_60);
                local_11 = 0;
              }
            }
            else {
              bVar3 = startsWith((char *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68
                                );
              if ((bVar3) && (bVar1)) {
                *(undefined1 *)((long)local_40 + (long)local_58) = 0;
                printf("warning: file %s should fail but it passes.\n",local_60);
                local_11 = 0;
              }
            }
          }
          free(local_70);
          bVar1 = false;
        }
        ParsedJson::~ParsedJson((ParsedJson *)local_130);
        if (bVar1) goto LAB_00102c6a;
      }
    }
    printf("%zu files checked.\n",local_50);
    if ((local_11 & 1) == 0) {
      fprintf(_stderr,"There were problems! Consider reviewing the following files:\n");
      for (local_140 = 0; local_140 < local_34; local_140 = local_140 + 1) {
        if ((*(byte *)((long)local_40 + (long)local_140) & 1) == 0) {
          fprintf(_stderr,"%s \n",local_30[local_140]->d_name);
        }
      }
    }
    else {
      printf("All ok!\n");
    }
    for (local_144 = 0; local_144 < local_34; local_144 = local_144 + 1) {
      free(local_30[local_144]);
    }
    free(local_30);
    if (local_40 != (void *)0x0) {
      operator_delete__(local_40);
    }
    local_1 = local_11 & 1;
  }
LAB_00102c6a:
  return (bool)(local_1 & 1);
}

Assistant:

bool validate(const char *dirname) {
  bool everythingfine = true;
  const char *extension = ".json";
  size_t dirlen = strlen(dirname);
  struct dirent **entry_list;
  int c = scandir(dirname, &entry_list, nullptr, alphasort);
  if (c < 0) {
    fprintf(stderr, "error accessing %s \n", dirname);
    return false;
  }
  if (c == 0) {
    printf("nothing in dir %s \n", dirname);
    return false;
  }
  bool * isfileasexpected = new bool[c];
  for(int i = 0; i < c; i++) { isfileasexpected[i] = true;
}
  size_t howmany = 0;
  bool needsep = (strlen(dirname) > 1) && (dirname[strlen(dirname) - 1] != '/');
  for (int i = 0; i < c; i++) {
    const char *name = entry_list[i]->d_name;
    if (hasExtension(name, extension)) {
      printf("validating: file %s ", name);
      fflush(nullptr);
      size_t filelen = strlen(name);
      char *fullpath = static_cast<char *>(malloc(dirlen + filelen + 1 + 1));
      strcpy(fullpath, dirname);
      if (needsep) {
        fullpath[dirlen] = '/';
        strcpy(fullpath + dirlen + 1, name);
      } else {
        strcpy(fullpath + dirlen, name);
      }
      std::string_view p;
      try {
        p = get_corpus(fullpath);
      } catch (const std::exception& e) {
        std::cerr << "Could not load the file " << fullpath << std::endl;
        return EXIT_FAILURE;
      }
      ParsedJson pj;
      bool allocok = pj.allocateCapacity(p.size(), 1024);
      if(!allocok) {
        std::cerr << "can't allocate memory"<<std::endl;
        return false;
      }
      ++howmany;
      bool isok = json_parse(p, pj);
      aligned_free((void*)p.data());
      printf("%s\n", isok ? "ok" : "invalid");
      if(contains("EXCLUDE",name)) {
        // skipping
        howmany--;
      } else if (startsWith("pass", name)) {
        if (!isok) {
          isfileasexpected[i] = false;
          printf("warning: file %s should pass but it fails.\n", name);
          everythingfine = false;
        }
      } else if (startsWith("fail", name)) {
        if (isok) {
          isfileasexpected[i] = false;
          printf("warning: file %s should fail but it passes.\n", name);
          everythingfine = false;
        }
      }
      free(fullpath);
    }
  }
  printf("%zu files checked.\n", howmany);
  if(everythingfine) {
    printf("All ok!\n");
  } else {
    fprintf(stderr, "There were problems! Consider reviewing the following files:\n");
    for(int i = 0; i < c; i++) {
      if(!isfileasexpected[i]) { fprintf(stderr, "%s \n", entry_list[i]->d_name);
}
    }
  }
  for (int i = 0; i < c; ++i) {
    free(entry_list[i]);
}
  free(entry_list);
  delete[] isfileasexpected;
  return everythingfine;
}